

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casDec.c
# Opt level: O0

int CreateDecomposedNetwork
              (DdManager *dd,DdNode *aFunc,char **pNames,int nNames,char *FileName,int nLutSize,
              int fCheck,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  LUT *pLVar5;
  DdNode **ppDVar6;
  DdNode *pDVar7;
  DdNode *n;
  DdNode *n_00;
  abctime aVar8;
  abctime aVar9;
  FILE *__stream;
  int *in_stack_fffffffffffffd08;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffffd10;
  DdNode *local_2e8;
  FILE *pFile;
  int v_1;
  int k;
  DdNode **pbTemp;
  int c;
  abctime clk2;
  DdNode *bVar;
  int CutLevel;
  DdNode *bVarsCube;
  DdNode *bVarsCCube;
  DdNode *bVarsInCube;
  int nVars;
  DdNode *bVars [32];
  int RetValue;
  abctime clk1;
  uint local_170;
  int nLutOutputsOrig;
  int nLutOutputs;
  int nLutsTotal;
  int nLuts;
  int fLastLut;
  int PrevMulti;
  int nVarsRem;
  DdNode *bCVars [32];
  int local_50;
  int local_4c;
  int v;
  int i;
  LUT *p;
  int nLutSize_local;
  char *FileName_local;
  int nNames_local;
  char **pNames_local;
  DdNode *aFunc_local;
  DdManager *dd_local;
  
  nLutOutputsOrig = 0;
  local_170 = 0;
  s_LutSize = nLutSize;
  s_nFuncVars = nNames;
  pNames_local = (char **)aFunc;
  aFunc_local = &dd->sentinel;
  aVar4 = Abc_Clock();
  Extra_ProfileWidth((DdManager *)aFunc_local,(DdNode *)pNames_local,
                     CreateDecomposedNetwork::Profile,-1);
  nLuts = 0;
  bVar1 = false;
  nLutOutputs = 0;
  iVar2 = nLutOutputs;
  fLastLut = nNames;
  do {
    nLutOutputs = iVar2;
    pLVar5 = (LUT *)malloc(0x38);
    memset(pLVar5,0,0x38);
    if (s_LutSize < fLastLut + nLuts) {
      pLVar5->nIns = s_LutSize;
      pLVar5->nInsP = nLuts;
      pLVar5->nCols = CreateDecomposedNetwork::Profile[nNames - (fLastLut - (s_LutSize - nLuts))];
      iVar2 = Abc_Base2Log(pLVar5->nCols);
      pLVar5->nMulti = iVar2;
      pLVar5->Level = nNames - fLastLut;
      fLastLut = fLastLut - (s_LutSize - nLuts);
      nLuts = pLVar5->nMulti;
    }
    else {
      pLVar5->nIns = fLastLut + nLuts;
      pLVar5->nInsP = nLuts;
      pLVar5->nCols = 2;
      pLVar5->nMulti = 1;
      pLVar5->Level = nNames - fLastLut;
      fLastLut = 0;
      nLuts = 1;
      bVar1 = true;
    }
    if (s_LutSize <= pLVar5->nMulti) {
      printf("The LUT size is too small\n");
      return 0;
    }
    ppDVar6 = (DdNode **)malloc((long)pLVar5->nCols << 3);
    pLVar5->pbCols = ppDVar6;
    ppDVar6 = (DdNode **)malloc((long)pLVar5->nCols << 3);
    pLVar5->pbCodes = ppDVar6;
    ppDVar6 = (DdNode **)malloc((long)pLVar5->nCols << 3);
    pLVar5->paNodes = ppDVar6;
    CreateDecomposedNetwork::pLuts[nLutOutputs] = pLVar5;
    iVar2 = nLutOutputs + 1;
  } while (!bVar1);
  for (local_4c = 0; local_4c < s_LutSize; local_4c = local_4c + 1) {
    pDVar7 = Cudd_bddNewVar((DdManager *)aFunc_local);
    *(DdNode **)(&PrevMulti + (long)local_4c * 2) = pDVar7;
  }
  s_EncodingTime = 0;
  local_4c = 0;
  do {
    if (iVar2 <= local_4c) {
      if (fVerbose != 0) {
        printf("LUTs: Total = %5d. Final = %5d. Simple = %5d. (%6.2f %%)  ",
               ((double)(int)(nLutOutputsOrig - local_170) * 100.0) / (double)nLutOutputsOrig,
               (ulong)(uint)nLutOutputsOrig,(ulong)local_170,(ulong)(nLutOutputsOrig - local_170));
        printf("Memory = %6.2f MB\n",
               ((double)(int)local_170 * 1.0 * (double)(1 << ((byte)nLutSize & 0x1f))) / 1048576.0);
        aVar8 = Abc_Clock();
        printf("Pure decomposition time   = %.2f sec\n",
               (double)((float)((aVar8 - aVar4) - s_EncodingTime) / 1e+06));
        printf("Encoding time             = %.2f sec\n",(double)((float)s_EncodingTime / 1e+06));
      }
      aVar4 = Abc_Clock();
      if (fCheck != 0) {
        __stream = fopen(FileName,"w");
        fprintf(__stream,".model %s\n",FileName);
        fprintf(__stream,".inputs");
        for (local_4c = 0; local_4c < nNames; local_4c = local_4c + 1) {
          fprintf(__stream," %s",pNames[local_4c]);
        }
        fprintf(__stream,"\n");
        fprintf(__stream,".outputs F");
        fprintf(__stream,"\n");
        WriteLUTSintoBLIFfile
                  ((FILE *)__stream,(DdManager *)aFunc_local,CreateDecomposedNetwork::pLuts,iVar2,
                   (DdNode **)&PrevMulti,pNames,nNames,FileName);
        fprintf(__stream,".end\n");
        fclose(__stream);
        if (fVerbose != 0) {
          aVar8 = Abc_Clock();
          printf("Output file writing time  = %.2f sec\n",(double)((float)(aVar8 - aVar4) / 1e+06));
        }
      }
      for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
        pLVar5 = CreateDecomposedNetwork::pLuts[local_4c];
        for (local_50 = 0; local_50 < pLVar5->nCols; local_50 = local_50 + 1) {
          Cudd_RecursiveDeref((DdManager *)aFunc_local,pLVar5->pbCols[local_50]);
          Cudd_RecursiveDeref((DdManager *)aFunc_local,pLVar5->pbCodes[local_50]);
          Cudd_RecursiveDeref((DdManager *)aFunc_local,pLVar5->paNodes[local_50]);
        }
        Cudd_RecursiveDeref((DdManager *)aFunc_local,pLVar5->bRelation);
        if (pLVar5->pbCols != (DdNode **)0x0) {
          free(pLVar5->pbCols);
          pLVar5->pbCols = (DdNode **)0x0;
        }
        if (pLVar5->pbCodes != (DdNode **)0x0) {
          free(pLVar5->pbCodes);
          pLVar5->pbCodes = (DdNode **)0x0;
        }
        if (pLVar5->paNodes != (DdNode **)0x0) {
          free(pLVar5->paNodes);
          pLVar5->paNodes = (DdNode **)0x0;
        }
        if (pLVar5 != (LUT *)0x0) {
          free(pLVar5);
        }
      }
      return 1;
    }
    pLVar5 = CreateDecomposedNetwork::pLuts[local_4c];
    iVar3 = (pLVar5->Level + pLVar5->nIns) - pLVar5->nInsP;
    uVar10 = (undefined4)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    if (local_4c == 0) {
      in_stack_fffffffffffffd08 = (int *)CONCAT44(uVar10,iVar3);
      bVars[0x1f]._4_4_ =
           Extra_bddNodePathsUnderCutArray
                     ((DdManager *)aFunc_local,(DdNode **)&pNames_local,(DdNode **)(aFunc_local + 1)
                      ,1,pLVar5->paNodes,pLVar5->pbCols,iVar3);
    }
    else {
      in_stack_fffffffffffffd08 = (int *)CONCAT44(uVar10,iVar3);
      bVars[0x1f]._4_4_ =
           Extra_bddNodePathsUnderCutArray
                     ((DdManager *)aFunc_local,
                      CreateDecomposedNetwork::pLuts[local_4c + -1]->paNodes,
                      CreateDecomposedNetwork::pLuts[local_4c + -1]->pbCodes,
                      CreateDecomposedNetwork::pLuts[local_4c + -1]->nCols,pLVar5->paNodes,
                      pLVar5->pbCols,iVar3);
    }
    if (bVars[0x1f]._4_4_ != pLVar5->nCols) {
      __assert_fail("RetValue == p->nCols",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                    ,0xf6,
                    "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                   );
    }
    iVar3 = pLVar5->nInsP;
    for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
      bVars[(long)local_50 + -1] =
           *(DdNode **)
            (&(aFunc_local[8].type.kids.E)->index +
            (long)(int)(&(aFunc_local[8].next)->index)[local_50] * 2);
    }
    pDVar7 = Extra_bddBitsToCube((DdManager *)aFunc_local,(1 << ((byte)iVar3 & 0x1f)) + -1,iVar3,
                                 (DdNode **)&stack0xfffffffffffffd78,1);
    Cudd_Ref(pDVar7);
    iVar3 = pLVar5->nIns - pLVar5->nInsP;
    for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
      bVars[(long)local_50 + -1] =
           *(DdNode **)
            (&(aFunc_local[8].type.kids.E)->index +
            (long)(int)(&(aFunc_local[8].next)->index)[pLVar5->Level + local_50] * 2);
    }
    n = Extra_bddBitsToCube((DdManager *)aFunc_local,(1 << ((byte)iVar3 & 0x1f)) + -1,iVar3,
                            (DdNode **)&stack0xfffffffffffffd78,1);
    Cudd_Ref(n);
    n_00 = Cudd_bddAnd((DdManager *)aFunc_local,n,pDVar7);
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref((DdManager *)aFunc_local,n);
    Cudd_RecursiveDeref((DdManager *)aFunc_local,pDVar7);
    if (local_4c == nLutOutputs) {
      if (pLVar5->nMulti != 1) {
        __assert_fail("p->nMulti == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                      ,0x115,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      if (pLVar5->nCols != 2) {
        __assert_fail("p->nCols == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                      ,0x116,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      if (*(int *)((ulong)*pLVar5->paNodes & 0xfffffffffffffffe) != 0x7fffffff) {
        __assert_fail("Cudd_IsConstant( p->paNodes[0] )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                      ,0x117,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      if (*(int *)((ulong)pLVar5->paNodes[1] & 0xfffffffffffffffe) != 0x7fffffff) {
        __assert_fail("Cudd_IsConstant( p->paNodes[1] )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                      ,0x118,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      if (*pLVar5->paNodes == *(DdNode **)(aFunc_local + 1)) {
        local_2e8 = _PrevMulti;
      }
      else {
        local_2e8 = (DdNode *)((ulong)_PrevMulti ^ 1);
      }
      pDVar7 = Cudd_bddIte((DdManager *)aFunc_local,local_2e8,*pLVar5->pbCols,pLVar5->pbCols[1]);
      pLVar5->bRelation = pDVar7;
      Cudd_Ref(pLVar5->bRelation);
    }
    else {
      aVar8 = Abc_Clock();
      in_stack_fffffffffffffd08 = &pLVar5->nSimple;
      pDVar7 = Extra_bddEncodingNonStrict
                         ((DdManager *)aFunc_local,pLVar5->pbCols,pLVar5->nCols,n_00,
                          (DdNode **)&PrevMulti,pLVar5->nMulti,in_stack_fffffffffffffd08);
      pLVar5->bRelation = pDVar7;
      Cudd_Ref(pLVar5->bRelation);
      aVar9 = Abc_Clock();
      s_EncodingTime = (aVar9 - aVar8) + s_EncodingTime;
    }
    local_170 = (pLVar5->nMulti - pLVar5->nSimple) + local_170;
    nLutOutputsOrig = pLVar5->nMulti + nLutOutputsOrig;
    if (fVerbose != 0) {
      in_stack_fffffffffffffd08 =
           (int *)CONCAT44((int)((ulong)in_stack_fffffffffffffd08 >> 0x20),pLVar5->nSimple);
      in_stack_fffffffffffffd10 =
           CONCAT44((int)((ulong)in_stack_fffffffffffffd10 >> 0x20),pLVar5->Level);
      printf("Stage %3d: In = %3d  InP = %3d  Cols = %5d  Multi = %2d  Simple = %2d  Level = %3d\n",
             (ulong)(local_4c + 1),(ulong)(uint)pLVar5->nIns,(ulong)(uint)pLVar5->nInsP,
             (ulong)(uint)pLVar5->nCols,(ulong)(uint)pLVar5->nMulti,in_stack_fffffffffffffd08,
             in_stack_fffffffffffffd10);
    }
    for (pbTemp._4_4_ = 0; pbTemp._4_4_ < pLVar5->nCols; pbTemp._4_4_ = pbTemp._4_4_ + 1) {
      pDVar7 = Cudd_bddAndAbstract((DdManager *)aFunc_local,pLVar5->bRelation,
                                   pLVar5->pbCols[pbTemp._4_4_],n_00);
      pLVar5->pbCodes[pbTemp._4_4_] = pDVar7;
      Cudd_Ref(pLVar5->pbCodes[pbTemp._4_4_]);
    }
    Cudd_RecursiveDeref((DdManager *)aFunc_local,n_00);
    ppDVar6 = (DdNode **)malloc((long)pLVar5->nCols << 3);
    for (pFile._0_4_ = 0; (int)pFile < *(int *)&aFunc_local[3].type; pFile._0_4_ = (int)pFile + 1) {
      CreateDecomposedNetwork::Permute[(int)pFile] = (int)pFile;
    }
    for (pFile._0_4_ = 0; (int)pFile < pLVar5->nMulti; pFile._0_4_ = (int)pFile + 1) {
      CreateDecomposedNetwork::Permute[**(uint **)(&PrevMulti + (long)(int)pFile * 2)] =
           (&(aFunc_local[8].next)->index)[(int)pFile];
    }
    Extra_bddPermuteArray
              ((DdManager *)aFunc_local,pLVar5->pbCodes,ppDVar6,pLVar5->nCols,
               CreateDecomposedNetwork::Permute);
    for (pFile._4_4_ = 0; pFile._4_4_ < pLVar5->nCols; pFile._4_4_ = pFile._4_4_ + 1) {
      Cudd_RecursiveDeref((DdManager *)aFunc_local,pLVar5->pbCodes[pFile._4_4_]);
      pLVar5->pbCodes[pFile._4_4_] = ppDVar6[pFile._4_4_];
    }
    if (ppDVar6 != (DdNode **)0x0) {
      free(ppDVar6);
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

int CreateDecomposedNetwork( DdManager * dd, DdNode * aFunc, char ** pNames, int nNames, char * FileName, int nLutSize, int fCheck, int fVerbose )
// aFunc is a 0-1 ADD for the given function
// pNames (nNames) are the input variable names
// FileName is the name of the output file for the LUT network
// dynamic variable reordering should be disabled when this function is running
{
    static LUT * pLuts[MAXINPUTS];   // the LUT cascade
    static int Profile[MAXINPUTS];   // the profile filled in with the info about the BDD width
    static int Permute[MAXINPUTS];   // the array to store a temporary permutation of variables

    LUT * p;               // the current LUT
    int i, v;

    DdNode * bCVars[32];   // these are variables for the codes

    int nVarsRem;          // the number of remaining variables
    int PrevMulti;         // column multiplicity on the previous level
    int fLastLut;          // flag to signal the last LUT
    int nLuts;
    int nLutsTotal = 0;
    int nLutOutputs = 0;
    int nLutOutputsOrig = 0;

    abctime clk1;

    s_LutSize = nLutSize;

    s_nFuncVars = nNames;

    // get the profile
    clk1 = Abc_Clock();
    Extra_ProfileWidth( dd, aFunc, Profile, -1 );


//  for ( v = 0; v < nNames; v++ )
//      printf( "Level = %2d, Width = %2d\n", v+1, Profile[v] );


//printf( "\n" );

    // mark-up the LUTs
    // assuming that the manager has exactly nNames vars (new vars have not been introduced yet)
    nVarsRem  = nNames;     // the number of remaining variables
    PrevMulti = 0;          // column multiplicity on the previous level
    fLastLut  = 0;
    nLuts     = 0;
    do
    {
        p = (LUT*) ABC_ALLOC( char, sizeof(LUT) );
        memset( p, 0, sizeof(LUT) );

        if ( nVarsRem + PrevMulti <= s_LutSize ) // this is the last LUT
        {
            p->nIns   = nVarsRem + PrevMulti;
            p->nInsP  = PrevMulti;
            p->nCols  = 2;
            p->nMulti = 1;
            p->Level  = nNames-nVarsRem;

            nVarsRem  = 0;
            PrevMulti = 1;

            fLastLut  = 1;
        }
        else // this is not the last LUT
        {
            p->nIns   = s_LutSize;
            p->nInsP  = PrevMulti;
            p->nCols  = Profile[nNames-(nVarsRem-(s_LutSize-PrevMulti))];
            p->nMulti = Abc_Base2Log(p->nCols);
            p->Level  = nNames-nVarsRem;

            nVarsRem  = nVarsRem-(s_LutSize-PrevMulti);
            PrevMulti = p->nMulti;
        }
        
        if ( p->nMulti >= s_LutSize )
        {
            printf( "The LUT size is too small\n" );
            return 0;
        }

        nLutOutputsOrig += p->nMulti;


//if ( fVerbose )
//printf( "Stage %2d: In = %3d, InP = %3d, Cols = %5d, Multi = %2d, Level = %2d\n", 
//       nLuts+1, p->nIns, p->nInsP, p->nCols, p->nMulti, p->Level );


        // there should be as many columns, codes, and nodes, as there are columns on this level
        p->pbCols  = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );
        p->pbCodes = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );
        p->paNodes = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );

        pLuts[nLuts] = p;
        nLuts++;
    }
    while ( !fLastLut );


//if ( fVerbose )
//printf( "The number of cascades = %d\n", nLuts );


//fprintf( pTable, "%d ", nLuts );


    // add the new variables at the bottom
    for ( i = 0; i < s_LutSize; i++ )
        bCVars[i] = Cudd_bddNewVar(dd);

    // for each LUT - assign the LUT and encode the columns
    s_EncodingTime = 0;
    for ( i = 0; i < nLuts; i++ )
    {
        int RetValue;
        DdNode * bVars[32];    
        int nVars;
        DdNode * bVarsInCube;
        DdNode * bVarsCCube;
        DdNode * bVarsCube;
        int CutLevel;

        p = pLuts[i];

        // compute the columns of this LUT starting from the given set of nodes with the given codes
        // (these codes have been remapped to depend on the topmost variables in the manager)
        // for the first LUT, start with the constant 1 BDD
        CutLevel = p->Level + p->nIns - p->nInsP;
        if ( i == 0 )
            RetValue = Extra_bddNodePathsUnderCutArray( 
                            dd, &aFunc, &(b1), 1, 
                            p->paNodes, p->pbCols, CutLevel );
        else
            RetValue = Extra_bddNodePathsUnderCutArray( 
                            dd, pLuts[i-1]->paNodes, pLuts[i-1]->pbCodes, pLuts[i-1]->nCols, 
                            p->paNodes, p->pbCols, CutLevel );
        assert( RetValue == p->nCols );
        // at this point, we have filled out p->paNodes[] and p->pbCols[] of this LUT
        // pLuts[i-1]->paNodes depended on normal vars
        // pLuts[i-1]->pbCodes depended on the topmost variables 
        // the resulting p->paNodes depend on normal ADD nodes
        // the resulting p->pbCols depend on normal vars and topmost variables in the manager

        // perform the encoding

        // create the cube of these variables
        // collect the topmost variables of the manager
        nVars = p->nInsP;
        for ( v = 0; v < nVars; v++ )
            bVars[v] = dd->vars[ dd->invperm[v] ];
        bVarsCCube  = Extra_bddBitsToCube( dd, (1<<nVars)-1, nVars, bVars, 1 );    Cudd_Ref( bVarsCCube );

        // collect the primary input variables involved in this LUT
        nVars = p->nIns - p->nInsP;
        for ( v = 0; v < nVars; v++ )
            bVars[v] = dd->vars[ dd->invperm[p->Level+v] ];
        bVarsInCube = Extra_bddBitsToCube( dd, (1<<nVars)-1, nVars, bVars, 1 );    Cudd_Ref( bVarsInCube );

        // get the cube
        bVarsCube   = Cudd_bddAnd( dd, bVarsInCube, bVarsCCube );              Cudd_Ref( bVarsCube );
        Cudd_RecursiveDeref( dd, bVarsInCube );
        Cudd_RecursiveDeref( dd, bVarsCCube );

        // get the encoding relation
        if ( i == nLuts -1 )
        {
            DdNode * bVar;
            assert( p->nMulti == 1 );
            assert( p->nCols == 2 );
            assert( Cudd_IsConstant( p->paNodes[0] ) );
            assert( Cudd_IsConstant( p->paNodes[1] ) );

            bVar = ( p->paNodes[0] == a1 )? bCVars[0]: Cudd_Not( bCVars[0] );
            p->bRelation = Cudd_bddIte( dd, bVar, p->pbCols[0], p->pbCols[1] );  Cudd_Ref( p->bRelation );
        }
        else
        {
            abctime clk2 = Abc_Clock();
//          p->bRelation = PerformTheEncoding( dd, p->pbCols, p->nCols, bVarsCube, bCVars, p->nMulti, &p->nSimple );  Cudd_Ref( p->bRelation );
            p->bRelation = Extra_bddEncodingNonStrict( dd, p->pbCols, p->nCols, bVarsCube, bCVars, p->nMulti, &p->nSimple );  Cudd_Ref( p->bRelation );
            s_EncodingTime += Abc_Clock() - clk2;
        }

        // update the number of LUT outputs
        nLutOutputs += (p->nMulti - p->nSimple);
        nLutsTotal += p->nMulti;

//if ( fVerbose )
//printf( "Stage %2d: Simple = %d\n", i+1, p->nSimple );

if ( fVerbose )
printf( "Stage %3d: In = %3d  InP = %3d  Cols = %5d  Multi = %2d  Simple = %2d  Level = %3d\n", 
       i+1, p->nIns, p->nInsP, p->nCols, p->nMulti, p->nSimple, p->Level );

        // get the codes from the relation (these are not necessarily cubes)
        {
            int c;
            for ( c = 0; c < p->nCols; c++ )
            {
                p->pbCodes[c] = Cudd_bddAndAbstract( dd, p->bRelation, p->pbCols[c], bVarsCube ); Cudd_Ref( p->pbCodes[c] );
            }
        }

        Cudd_RecursiveDeref( dd, bVarsCube );

        // remap the codes to depend on the topmost varibles of the manager
        // useful as a preparation for the next step
        {
            DdNode ** pbTemp;
            int k, v;

            pbTemp = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );

            // create the identical permutation
            for ( v = 0; v < dd->size; v++ )
                Permute[v] = v;

            // use the topmost variables of the manager 
            // to represent the previous level codes
            for ( v = 0; v < p->nMulti; v++ )
                Permute[bCVars[v]->index] = dd->invperm[v];

            Extra_bddPermuteArray( dd, p->pbCodes, pbTemp, p->nCols, Permute );
            // the array pbTemp comes already referenced

            // deref the old codes and assign the new ones
            for ( k = 0; k < p->nCols; k++ )
            {
                Cudd_RecursiveDeref( dd, p->pbCodes[k] );
                p->pbCodes[k] = pbTemp[k];
            }
            ABC_FREE( pbTemp );
        }
    } 
    if ( fVerbose )
    printf( "LUTs: Total = %5d. Final = %5d. Simple = %5d. (%6.2f %%)  ", 
        nLutsTotal, nLutOutputs, nLutsTotal-nLutOutputs, 100.0*(nLutsTotal-nLutOutputs)/nLutsTotal );
    if ( fVerbose )
    printf( "Memory = %6.2f MB\n", 1.0*nLutOutputs*(1<<nLutSize)/(1<<20) );
//  printf( "\n" );

//fprintf( pTable, "%d ", nLutOutputsOrig );
//fprintf( pTable, "%d ", nLutOutputs );

    if ( fVerbose )
    {
    printf( "Pure decomposition time   = %.2f sec\n", (float)(Abc_Clock() - clk1 - s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
    printf( "Encoding time             = %.2f sec\n", (float)(s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
//  printf( "Encoding search time      = %.2f sec\n", (float)(s_EncSearchTime)/(float)(CLOCKS_PER_SEC) );
//  printf( "Encoding compute time     = %.2f sec\n", (float)(s_EncComputeTime)/(float)(CLOCKS_PER_SEC) );
    }


//fprintf( pTable, "%.2f ", (float)(s_ReadingTime)/(float)(CLOCKS_PER_SEC) );
//fprintf( pTable, "%.2f ", (float)(Abc_Clock() - clk1 - s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
//fprintf( pTable, "%.2f ", (float)(s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
//fprintf( pTable, "%.2f ", (float)(s_RemappingTime)/(float)(CLOCKS_PER_SEC) );


    // write LUTs into the BLIF file
    clk1 = Abc_Clock();
    if ( fCheck )
    {
        FILE * pFile;
        // start the file
        pFile = fopen( FileName, "w" );
        fprintf( pFile, ".model %s\n", FileName );

        fprintf( pFile, ".inputs" );
        for ( i = 0; i < nNames; i++ )
            fprintf( pFile, " %s", pNames[i] );
        fprintf( pFile, "\n" );
        fprintf( pFile, ".outputs F" );
        fprintf( pFile, "\n" );

        // write the DD into the file
        WriteLUTSintoBLIFfile( pFile, dd, pLuts, nLuts, bCVars, pNames, nNames, FileName );

        fprintf( pFile, ".end\n" );
        fclose( pFile );
        if ( fVerbose )
        printf( "Output file writing time  = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
    }


    // updo the LUT cascade
    for ( i = 0; i < nLuts; i++ )
    {
        p = pLuts[i];
        for ( v = 0; v < p->nCols; v++ )
        {
            Cudd_RecursiveDeref( dd, p->pbCols[v] );
            Cudd_RecursiveDeref( dd, p->pbCodes[v] );
            Cudd_RecursiveDeref( dd, p->paNodes[v] );
        }
        Cudd_RecursiveDeref( dd, p->bRelation );

        ABC_FREE( p->pbCols );
        ABC_FREE( p->pbCodes );
        ABC_FREE( p->paNodes );
        ABC_FREE( p );
    }

    return 1;
}